

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# password.c
# Opt level: O0

int password_verify(char *password,char *hash)

{
  byte bVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  int status;
  size_t len;
  size_t i;
  char output [61];
  char *hash_local;
  char *password_local;
  
  bVar1 = 0;
  if (password == (char *)0x0) {
    if (-1 < msgno) {
      fprintf(_stderr,"password_verify: missing password\n");
    }
    password_local._4_4_ = -1;
  }
  else if (hash == (char *)0x0) {
    if (-1 < msgno) {
      fprintf(_stderr,"password_verify: missing hash\n");
    }
    password_local._4_4_ = -1;
  }
  else {
    if ((0 < msgno) && (-1 < msgno)) {
      fprintf(_stderr,"password_verify: parameters\n  password => %s\n  hash     => %s\n",password,
              hash);
    }
    memset(&i,0,0x3d);
    pcVar2 = _crypt_blowfish_rn(password,hash,(char *)&i,0x3d);
    if (pcVar2 == (char *)0x0) {
      if ((0 < msgno) && (-1 < msgno)) {
        fprintf(_stderr,"password_verify: blowfish run.\n");
      }
      password_local._4_4_ = -1;
    }
    else {
      sVar3 = strlen((char *)&i);
      sVar4 = strlen(hash);
      if ((sVar3 == sVar4) && (0xd < sVar3)) {
        for (len = 0; len < sVar3; len = len + 1) {
          bVar1 = output[len - 8] ^ hash[len] | bVar1;
        }
        if (bVar1 == 0) {
          password_local._4_4_ = 0;
        }
        else {
          password_local._4_4_ = -1;
        }
      }
      else {
        if ((0 < msgno) && (-1 < msgno)) {
          fprintf(_stderr,"password_verify: hash length.\n");
        }
        password_local._4_4_ = -1;
      }
    }
  }
  return password_local._4_4_;
}

Assistant:

int
password_verify(const char *password, const char *hash)
{
    char output[BLOWFISH_LEN+1];
    size_t i, len;
    int status = 0;

    if (!password) {
        msg_error(verify, "missing password\n");
        return -1;
    }
    if (!hash) {
        msg_error(verify, "missing hash\n");
        return -1;
    }

    msg_verbose(verify, "parameters\n"
                "  password => %s\n"
                "  hash     => %s\n",
                password, hash);

    memset(output, 0, sizeof(output));

    if (_crypt_blowfish_rn(password, hash, output, sizeof(output)) == NULL) {
        msg_verbose(verify, "blowfish run.\n");
        return -1;
    }

    len = strlen(output);
    if (len != strlen(hash) || len <= 13) {
        msg_verbose(verify, "hash length.\n");
        return -1;
    }

    for (i = 0; i < len; i++) {
        status |= (output[i] ^ hash[i]);
    }

    if (status != 0) {
        return -1;
    }

    return 0;
}